

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

bool CB_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  example *ec;
  wclass *pwVar3;
  bool bVar4;
  ostream *poVar5;
  vw_exception *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  string sStack_208;
  string local_1e8;
  string local_1c8;
  stringstream __msg;
  ostream local_198;
  
  uVar9 = 0;
  uVar8 = 0;
  while( true ) {
    ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3) <= uVar8) {
      if (uVar9 < 2) {
        return uVar9 == 0;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_198,"cb_adf: badly formatted example, only one line can have a cost");
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
                 ,0x90,&sStack_208);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    ec = ppeVar2[uVar8];
    pwVar3 = (ec->l).cs.costs._begin;
    uVar7 = (long)(ec->l).cs.costs._end - (long)pwVar3;
    if (0x10 < uVar7) break;
    if ((uVar7 == 0x10) && ((fVar1 = pwVar3->x, fVar1 != 3.4028235e+38 || (NAN(fVar1))))) {
      uVar9 = uVar9 + 1;
    }
    bVar4 = CB::ec_is_example_header(ec);
    if (uVar8 != 0 && bVar4) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar5 = std::operator<<(&local_198,"warning: example headers at position ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,": can only have in initial position!");
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
                 ,0x89,&local_1e8);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar8 = uVar8 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_198,"cb_adf: badly formatted example, only one cost can be known.");
  pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
             ,0x82,&local_1c8);
  __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_adf_sequence(multi_ex& ec_seq)
{
  uint32_t count = 0;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
      count += 1;

    if (CB::ec_is_example_header(*ec))
      if (k != 0)
        THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }
  if (count == 0)
    return true;
  else if (count == 1)
    return false;
  else
    THROW("cb_adf: badly formatted example, only one line can have a cost");
}